

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::LoadWavefrontMesh
          (ChTriangleMeshConnected *this,string *filename,bool load_normals,bool load_uv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  pointer piVar7;
  bool bVar8;
  ostream *poVar9;
  undefined7 in_register_00000009;
  pointer psVar10;
  undefined7 in_register_00000011;
  size_t j;
  ulong uVar11;
  size_t i_2;
  long lVar12;
  size_t i;
  ulong uVar13;
  ChVector<double> local_188;
  ulong local_168;
  undefined4 local_15c;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  string err;
  string warn;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  attrib_t att;
  
  filesystem::path::path((path *)&att,filename);
  bVar8 = filesystem::path::is_file((path *)&att);
  if (bVar8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    warn._M_dataplus._M_p = (pointer)&warn.field_2;
    err._M_dataplus._M_p = (pointer)&err.field_2;
    att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    warn._M_string_length = 0;
    err._M_string_length = 0;
    shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    warn.field_2._M_local_buf[0] = '\0';
    err.field_2._M_local_buf[0] = '\0';
    bVar8 = tinyobj::LoadObj(&att,&shapes,&materials,&warn,&err,(filename->_M_dataplus)._M_p,
                             (char *)0x0,true,true);
    if (bVar8) {
      pCVar4 = (this->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_vertices).
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish != pCVar4) {
        (this->m_vertices).
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = pCVar4;
      }
      pCVar4 = (this->m_normals).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_normals).
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish != pCVar4) {
        (this->m_normals).
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = pCVar4;
      }
      pCVar5 = (this->m_UV).
               super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_UV).
          super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pCVar5) {
        (this->m_UV).
        super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = pCVar5;
      }
      pCVar6 = (this->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_face_v_indices).
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_finish != pCVar6) {
        (this->m_face_v_indices).
        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar6;
      }
      pCVar6 = (this->m_face_n_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_face_n_indices).
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_finish != pCVar6) {
        (this->m_face_n_indices).
        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar6;
      }
      pCVar6 = (this->m_face_uv_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_face_uv_indices).
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_finish != pCVar6) {
        (this->m_face_uv_indices).
        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar6;
      }
      std::__cxx11::string::_M_assign((string *)&this->m_filename);
      local_15c = (undefined4)CONCAT71(in_register_00000009,load_uv);
      local_168 = CONCAT44(local_168._4_4_,(int)CONCAT71(in_register_00000011,load_normals));
      lVar12 = 8;
      uVar13 = 0;
      while( true ) {
        if ((ulong)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) / 3 <= uVar13) break;
        local_188.m_data[2] =
             (double)*(float *)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar12);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)((long)att.vertices.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar12 + -8);
        local_188.m_data._0_16_ = vcvtps2pd_avx(auVar1);
        std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
        emplace_back<chrono::ChVector<double>>
                  ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                   &this->m_vertices,&local_188);
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0xc;
      }
      if ((char)local_168 != '\0') {
        lVar12 = 8;
        uVar13 = 0;
        while( true ) {
          if ((ulong)((long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) / 3 <= uVar13) break;
          local_188.m_data[2] =
               (double)*(float *)((long)att.normals.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar12);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)((long)att.normals.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar12 + -8);
          local_188.m_data._0_16_ = vcvtps2pd_avx(auVar2);
          std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
          emplace_back<chrono::ChVector<double>>
                    ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                     &this->m_normals,&local_188);
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0xc;
        }
      }
      if ((char)local_15c != '\0') {
        for (uVar13 = 0;
            uVar13 < (ulong)((long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2) >> 1;
            uVar13 = uVar13 + 1) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(att.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar13 * 2);
          local_188.m_data._0_16_ = vcvtps2pd_avx(auVar3);
          std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
          emplace_back<chrono::ChVector2<double>>
                    ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)
                     &this->m_UV,(ChVector2<double> *)&local_188);
        }
      }
      uVar13 = 0;
      psVar10 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (uVar13 < (ulong)(((long)shapes.
                                     super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10) /
                             0xe0)) {
        lVar12 = 0;
        uVar11 = 0;
        local_168 = uVar13;
        while( true ) {
          auVar3 = (undefined1  [16])local_188.m_data._0_16_;
          piVar7 = psVar10[uVar13].mesh.indices.
                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)(((long)psVar10[uVar13].mesh.indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)piVar7) / 0xc) / 3
              <= uVar11) break;
          local_188.m_data[0]._4_4_ = *(undefined4 *)((long)(piVar7 + 1) + lVar12);
          local_188.m_data[0]._0_4_ = *(undefined4 *)((long)&piVar7->vertex_index + lVar12);
          local_188.m_data[1]._4_4_ = auVar3._12_4_;
          local_188.m_data[1]._0_4_ = *(int *)((long)(piVar7 + 2) + lVar12);
          std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
          emplace_back<chrono::ChVector<int>>
                    ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                     &this->m_face_v_indices,(ChVector<int> *)&local_188);
          auVar3 = (undefined1  [16])local_188.m_data._0_16_;
          if ((this->m_normals).
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->m_normals).
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            piVar7 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar13].mesh.indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_start;
            local_188.m_data[0]._4_4_ = *(undefined4 *)((long)(piVar7 + 1) + 4U + lVar12);
            local_188.m_data[0]._0_4_ = *(undefined4 *)((long)&piVar7->normal_index + lVar12);
            local_188.m_data[1]._4_4_ = auVar3._12_4_;
            local_188.m_data[1]._0_4_ = *(int *)((long)(piVar7 + 2) + 4U + lVar12);
            std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
            emplace_back<chrono::ChVector<int>>
                      ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                       &this->m_face_n_indices,(ChVector<int> *)&local_188);
          }
          auVar3 = (undefined1  [16])local_188.m_data._0_16_;
          if ((this->m_UV).
              super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->m_UV).
              super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            piVar7 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar13].mesh.indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_start;
            local_188.m_data[0]._4_4_ = *(undefined4 *)((long)(piVar7 + 1) + 8U + lVar12);
            local_188.m_data[0]._0_4_ = *(undefined4 *)((long)&piVar7->texcoord_index + lVar12);
            local_188.m_data[1]._4_4_ = auVar3._12_4_;
            local_188.m_data[1]._0_4_ = *(int *)((long)(piVar7 + 2) + 8U + lVar12);
            std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
            emplace_back<chrono::ChVector<int>>
                      ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                       &this->m_face_uv_indices,(ChVector<int> *)&local_188);
          }
          uVar11 = uVar11 + 1;
          lVar12 = lVar12 + 0x24;
          psVar10 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        uVar13 = local_168 + 1;
      }
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Error loading OBJ file ");
      poVar9 = std::operator<<(poVar9,(string *)filename);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cerr,"   tiny_obj warning message: ");
      poVar9 = std::operator<<(poVar9,(string *)&warn);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cerr,"   tiny_obj error message:   ");
      poVar9 = std::operator<<(poVar9,(string *)&err);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&warn);
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
    tinyobj::attrib_t::~attrib_t(&att);
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
    return bVar8;
  }
  __assert_fail("filesystem::path(filename).is_file()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/geometry/ChTriangleMeshConnected.cpp"
                ,0xf1,
                "bool chrono::geometry::ChTriangleMeshConnected::LoadWavefrontMesh(const std::string &, bool, bool)"
               );
}

Assistant:

bool ChTriangleMeshConnected::LoadWavefrontMesh(const std::string& filename, bool load_normals, bool load_uv) {
    assert(filesystem::path(filename).is_file());

    std::vector<tinyobj::shape_t> shapes;
    tinyobj::attrib_t att;
    std::vector<tinyobj::material_t> materials;
    std::string warn;
    std::string err;

    bool success = tinyobj::LoadObj(&att, &shapes, &materials, &warn, &err, filename.c_str());
    if (!success) {
        std::cerr << "Error loading OBJ file " << filename << std::endl;
        std::cerr << "   tiny_obj warning message: " << warn << std::endl;
        std::cerr << "   tiny_obj error message:   " << err << std::endl;
        return false;
    }

    m_vertices.clear();
    m_normals.clear();
    m_UV.clear();
    m_face_v_indices.clear();
    m_face_n_indices.clear();
    m_face_uv_indices.clear();

    m_filename = filename;

    for (size_t i = 0; i < att.vertices.size() / 3; i++) {
        m_vertices.push_back(ChVector<>(att.vertices[3 * i + 0], att.vertices[3 * i + 1], att.vertices[3 * i + 2]));
    }
    if (load_normals) {
        for (size_t i = 0; i < att.normals.size() / 3; i++) {
            m_normals.push_back(ChVector<>(att.normals[3 * i + 0], att.normals[3 * i + 1], att.normals[3 * i + 2]));
        }
    }
    if (load_uv) {
        for (size_t i = 0; i < att.texcoords.size() / 2; i++) {
            m_UV.push_back(ChVector2<>(att.texcoords[2 * i + 0], att.texcoords[2 * i + 1]));
        }
    }

    for (size_t i = 0; i < shapes.size(); i++) {
        for (size_t j = 0; j < shapes[i].mesh.indices.size() / 3; j++) {
            m_face_v_indices.push_back(ChVector<int>(shapes[i].mesh.indices[3 * j + 0].vertex_index,
                                                     shapes[i].mesh.indices[3 * j + 1].vertex_index,
                                                     shapes[i].mesh.indices[3 * j + 2].vertex_index));
            if (m_normals.size() > 0) {
                m_face_n_indices.push_back(ChVector<int>(shapes[i].mesh.indices[3 * j + 0].normal_index,
                                                         shapes[i].mesh.indices[3 * j + 1].normal_index,
                                                         shapes[i].mesh.indices[3 * j + 2].normal_index));
            }
            if (m_UV.size() > 0) {
                m_face_uv_indices.push_back(ChVector<int>(shapes[i].mesh.indices[3 * j + 0].texcoord_index,
                                                          shapes[i].mesh.indices[3 * j + 1].texcoord_index,
                                                          shapes[i].mesh.indices[3 * j + 2].texcoord_index));
            }
        }
    }

    return true;
}